

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSON.cc
# Opt level: O1

JSON JSON::makeDictionary(void)

{
  undefined8 *puVar1;
  _Head_base<0UL,_JSON::JSON_value_*,_false> __p;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  element_type *in_RDI;
  JSON JVar2;
  
  puVar1 = (undefined8 *)operator_new(0x40);
  *(undefined4 *)(puVar1 + 1) = 1;
  *puVar1 = &PTR__JSON_dictionary_002f1f50;
  *(undefined4 *)(puVar1 + 3) = 0;
  puVar1[4] = 0;
  puVar1[5] = puVar1 + 3;
  puVar1[6] = puVar1 + 3;
  puVar1[7] = 0;
  __p._M_head_impl = (JSON_value *)operator_new(0x18);
  (__p._M_head_impl)->_vptr_JSON_value = (_func_int **)puVar1;
  *(qpdf_offset_t *)&(__p._M_head_impl)->type_code = 0;
  __p._M_head_impl[1]._vptr_JSON_value = (_func_int **)0x0;
  (in_RDI->value)._M_t.
  super___uniq_ptr_impl<JSON::JSON_value,_std::default_delete<JSON::JSON_value>_>._M_t.
  super__Tuple_impl<0UL,_JSON::JSON_value_*,_std::default_delete<JSON::JSON_value>_>.
  super__Head_base<0UL,_JSON::JSON_value_*,_false>._M_head_impl = __p._M_head_impl;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<JSON::Members*>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&in_RDI->start,
             (Members *)__p._M_head_impl);
  JVar2.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  JVar2.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (JSON)JVar2.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

JSON
JSON::makeDictionary()
{
    return {std::make_unique<JSON_dictionary>()};
}